

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-flate.c
# Opt level: O2

hd_stream * hd_open_flated(hd_context *ctx,hd_stream *chain,int window_bits)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  hd_stream *phVar3;
  hd_flate *state;
  int code;
  
  state = (hd_flate *)0x0;
  code = 0;
  hd_var_imp(&code);
  hd_var_imp(&state);
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      state = (hd_flate *)hd_calloc(ctx,1,0x1078);
      state->chain = chain;
      (state->z).zalloc = zalloc_flate;
      (state->z).zfree = zfree_flate;
      (state->z).opaque = ctx;
      (state->z).next_in = (Bytef *)0x0;
      (state->z).avail_in = 0;
      code = inflateInit2_(&state->z,window_bits,"1.2.11",0x70);
      if (code != 0) {
        hd_throw(ctx,2,"zlib error: inflateInit: %s",(state->z).msg);
      }
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    phVar3 = hd_new_stream(ctx,state,next_flated,close_flated);
    return phVar3;
  }
  if ((state != (hd_flate *)0x0) && (code == 0)) {
    inflateEnd(&state->z);
  }
  hd_free(ctx,state);
  hd_drop_stream(ctx,chain);
  hd_rethrow(ctx);
}

Assistant:

hd_stream *
hd_open_flated(hd_context *ctx, hd_stream *chain, int window_bits)
{
    hd_flate *state = NULL;
    int code = Z_OK;

    hd_var(code);
    hd_var(state);

    hd_try(ctx)
    {
        state = hd_malloc_struct(ctx, hd_flate);
        state->chain = chain;

        state->z.zalloc = zalloc_flate;
        state->z.zfree = zfree_flate;
        state->z.opaque = ctx;
        state->z.next_in = NULL;
        state->z.avail_in = 0;

        code = inflateInit2(&state->z, window_bits);
        if (code != Z_OK)
            hd_throw(ctx, HD_ERROR_GENERIC, "zlib error: inflateInit: %s", state->z.msg);
    }
    hd_catch(ctx)
    {
        if (state && code == Z_OK)
            inflateEnd(&state->z);
        hd_free(ctx, state);
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }
    return hd_new_stream(ctx, state, next_flated, close_flated);
}